

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void renumberCursors(Parse *pParse,Select *p,int iExcept,int *aCsrMap)

{
  Walker w;
  Walker local_48;
  
  srclistRenumberCursors(pParse,aCsrMap,p->pSrc,iExcept);
  local_48.walkerDepth = 0;
  local_48.eCode = 0;
  local_48._38_2_ = 0;
  local_48.pParse = (Parse *)0x0;
  local_48.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
  local_48.xExprCallback = renumberCursorsCb;
  local_48.xSelectCallback = sqlite3SelectWalkNoop;
  local_48.u.aiCol = aCsrMap;
  sqlite3WalkSelect(&local_48,p);
  return;
}

Assistant:

static void renumberCursors(
  Parse *pParse,                  /* Parse context */
  Select *p,                      /* Select to renumber cursors within */
  int iExcept,                    /* FROM clause item to skip */
  int *aCsrMap                    /* Working space */
){
  Walker w;
  srclistRenumberCursors(pParse, aCsrMap, p->pSrc, iExcept);
  memset(&w, 0, sizeof(w));
  w.u.aiCol = aCsrMap;
  w.xExprCallback = renumberCursorsCb;
  w.xSelectCallback = sqlite3SelectWalkNoop;
  sqlite3WalkSelect(&w, p);
}